

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O3

duckdb_state
duckdb_open_internal
          (DBInstanceCacheWrapper *cache,char *path,duckdb_database *out,duckdb_config config,
          char **out_error)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  duckdb_database p_Var4;
  pointer database;
  DBConfig *pDVar5;
  DuckDB *__tmp;
  string path_str;
  DBConfig default_config;
  string local_758;
  undefined1 local_738 [32];
  char *local_718;
  undefined1 local_710 [16];
  __native_type local_700;
  DBConfig local_6d0;
  
  local_718 = path;
  p_Var4 = (duckdb_database)operator_new(0x10);
  *(undefined8 *)p_Var4 = 0;
  *(undefined8 *)(p_Var4 + 8) = 0;
  duckdb::DBConfig::DBConfig(&local_6d0);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"duckdb_api","");
  duckdb::Value::Value((Value *)local_710,"capi");
  duckdb::DBConfig::SetOptionByName(&local_6d0,&local_758,(Value *)local_710);
  duckdb::Value::~Value((Value *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p);
  }
  pDVar5 = &local_6d0;
  if (config != (duckdb_config)0x0) {
    pDVar5 = (DBConfig *)config;
  }
  local_738._24_8_ = pDVar5;
  if (cache != (DBInstanceCacheWrapper *)0x0) {
    local_710._8_8_ = (element_type *)0x0;
    local_700.__size[0] = '\0';
    local_710._0_8_ = &local_700;
    if (path != (char *)0x0) {
      strlen(path);
      std::__cxx11::string::_M_replace((ulong)local_710,0,(char *)0x0,(ulong)path);
    }
    database = duckdb::
               unique_ptr<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>,_true>
               ::operator->(&cache->instance_cache);
    local_758.field_2._M_allocated_capacity = 0;
    local_758.field_2._8_8_ = 0;
    local_758._M_dataplus._M_p = (pointer)0x0;
    local_758._M_string_length = 0;
    duckdb::DBInstanceCache::GetOrCreateInstance
              ((DBInstanceCache *)local_738,(string *)database,(DBConfig *)local_710,SUB81(pDVar5,0)
               ,(function<void_(duckdb::DuckDB_&)> *)&DAT_00000001);
    uVar3 = local_738._8_8_;
    uVar2 = local_738._0_8_;
    local_738._0_8_ = (__buckets_ptr)0x0;
    local_738._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var4 + 8);
    *(undefined8 *)p_Var4 = uVar2;
    *(undefined8 *)(p_Var4 + 8) = uVar3;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_);
    }
    if ((code *)local_758.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_758.field_2._M_allocated_capacity)(&local_758,&local_758,3);
    }
    if ((__native_type *)local_710._0_8_ != &local_700) {
      operator_delete((void *)local_710._0_8_);
    }
    goto LAB_015de18a;
  }
  local_710._0_8_ = (__native_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DuckDB,std::allocator<duckdb::DuckDB>,char_const*&,duckdb::DBConfig*&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_710 + 8),(DuckDB **)local_710,
             (allocator<duckdb::DuckDB> *)&local_758,&local_718,(DBConfig **)(local_738 + 0x18));
  uVar3 = local_710._8_8_;
  uVar2 = local_710._0_8_;
  if ((element_type *)local_710._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_710._8_8_ + 8) = *(int *)(local_710._8_8_ + 8) + 1;
      UNLOCK();
      if ((element_type *)local_710._8_8_ == (element_type *)0x0) goto LAB_015de170;
    }
    else {
      *(int *)(local_710._8_8_ + 8) = *(int *)(local_710._8_8_ + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_710._8_8_);
  }
LAB_015de170:
  *(undefined8 *)p_Var4 = uVar2;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var4 + 8);
  *(undefined8 *)(p_Var4 + 8) = uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
LAB_015de18a:
  duckdb::DBConfig::~DBConfig(&local_6d0);
  *out = p_Var4;
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_open_internal(DBInstanceCacheWrapper *cache, const char *path, duckdb_database *out,
                                  duckdb_config config, char **out_error) {
	auto wrapper = new DatabaseWrapper();
	try {
		DBConfig default_config;
		default_config.SetOptionByName("duckdb_api", "capi");

		DBConfig *db_config = &default_config;
		DBConfig *user_config = reinterpret_cast<DBConfig *>(config);
		if (user_config) {
			db_config = user_config;
		}

		if (cache) {
			duckdb::string path_str;
			if (path) {
				path_str = path;
			}
			wrapper->database = cache->instance_cache->GetOrCreateInstance(path_str, *db_config, true);
		} else {
			wrapper->database = duckdb::make_shared_ptr<DuckDB>(path, db_config);
		}

	} catch (std::exception &ex) {
		if (out_error) {
			ErrorData parsed_error(ex);
			*out_error = strdup(parsed_error.Message().c_str());
		}
		delete wrapper;
		return DuckDBError;

	} catch (...) { // LCOV_EXCL_START
		if (out_error) {
			*out_error = strdup("Unknown error");
		}
		delete wrapper;
		return DuckDBError;
	} // LCOV_EXCL_STOP

	*out = reinterpret_cast<duckdb_database>(wrapper);
	return DuckDBSuccess;
}